

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printStats(JSPrinter *this,Ref stats)

{
  Ref node;
  bool bVar1;
  bool bVar2;
  Value *pVVar3;
  undefined8 *puVar4;
  Ref curr;
  size_t i;
  bool first;
  JSPrinter *this_local;
  Ref stats_local;
  
  bVar1 = true;
  curr.inst = (Value *)0x0;
  this_local = (JSPrinter *)stats.inst;
  while( true ) {
    pVVar3 = Ref::operator->((Ref *)&this_local);
    pVVar3 = (Value *)Value::size(pVVar3);
    if (pVVar3 <= curr.inst) break;
    puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
    node.inst = (Value *)*puVar4;
    bVar2 = isNothing(this,node);
    if (!bVar2) {
      if (bVar1) {
        bVar1 = false;
      }
      else {
        newline(this);
      }
      print(this,node);
      bVar2 = isDefun(this,node);
      if (((!bVar2) && (bVar2 = endsInBlock(this,node), !bVar2)) &&
         (bVar2 = isIf(this,node), !bVar2)) {
        emit(this,';');
      }
    }
    curr.inst = (Value *)((long)&(curr.inst)->type + 1);
  }
  return;
}

Assistant:

void printStats(Ref stats) {
    bool first = true;
    for (size_t i = 0; i < stats->size(); i++) {
      Ref curr = stats[i];
      if (!isNothing(curr)) {
        if (first) {
          first = false;
        } else {
          newline();
        }
        print(curr);
        if (!isDefun(curr) && !endsInBlock(curr) && !isIf(curr)) {
          emit(';');
        }
      }
    }
  }